

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btContactSolverInfo.h
# Opt level: O2

void __thiscall btContactSolverInfo::btContactSolverInfo(btContactSolverInfo *this)

{
  (this->super_btContactSolverInfoData).m_tau = 0.6;
  (this->super_btContactSolverInfoData).m_damping = 1.0;
  (this->super_btContactSolverInfoData).m_friction = 0.3;
  (this->super_btContactSolverInfoData).m_timeStep = 0.016666668;
  (this->super_btContactSolverInfoData).m_restitution = 0.0;
  (this->super_btContactSolverInfoData).m_numIterations = 10;
  (this->super_btContactSolverInfoData).m_globalCfm = 0.0;
  (this->super_btContactSolverInfoData).m_splitImpulse = 1;
  (this->super_btContactSolverInfoData).m_maxErrorReduction = 20.0;
  (this->super_btContactSolverInfoData).m_sor = 1.0;
  (this->super_btContactSolverInfoData).m_erp = 0.2;
  (this->super_btContactSolverInfoData).m_erp2 = 0.8;
  (this->super_btContactSolverInfoData).m_splitImpulsePenetrationThreshold = -0.04;
  (this->super_btContactSolverInfoData).m_splitImpulseTurnErp = 0.1;
  (this->super_btContactSolverInfoData).m_linearSlop = 0.0;
  (this->super_btContactSolverInfoData).m_warmstartingFactor = 0.85;
  (this->super_btContactSolverInfoData).m_solverMode = 0x104;
  (this->super_btContactSolverInfoData).m_restingContactRestitutionThreshold = 2;
  (this->super_btContactSolverInfoData).m_minimumSolverBatchSize = 0x80;
  (this->super_btContactSolverInfoData).m_maxGyroscopicForce = 100.0;
  (this->super_btContactSolverInfoData).m_singleAxisRollingFrictionThreshold = 1e+30;
  return;
}

Assistant:

inline btContactSolverInfo()
	{
		m_tau = btScalar(0.6);
		m_damping = btScalar(1.0);
		m_friction = btScalar(0.3);
		m_timeStep = btScalar(1.f/60.f);
		m_restitution = btScalar(0.);
		m_maxErrorReduction = btScalar(20.);
		m_numIterations = 10;
		m_erp = btScalar(0.2);
		m_erp2 = btScalar(0.8);
		m_globalCfm = btScalar(0.);
		m_sor = btScalar(1.);
		m_splitImpulse = true;
		m_splitImpulsePenetrationThreshold = -.04f;
		m_splitImpulseTurnErp = 0.1f;
		m_linearSlop = btScalar(0.0);
		m_warmstartingFactor=btScalar(0.85);
		//m_solverMode =  SOLVER_USE_WARMSTARTING |  SOLVER_SIMD | SOLVER_DISABLE_VELOCITY_DEPENDENT_FRICTION_DIRECTION|SOLVER_USE_2_FRICTION_DIRECTIONS|SOLVER_ENABLE_FRICTION_DIRECTION_CACHING;// | SOLVER_RANDMIZE_ORDER;
		m_solverMode = SOLVER_USE_WARMSTARTING | SOLVER_SIMD;// | SOLVER_RANDMIZE_ORDER;
		m_restingContactRestitutionThreshold = 2;//unused as of 2.81
		m_minimumSolverBatchSize = 128; //try to combine islands until the amount of constraints reaches this limit
		m_maxGyroscopicForce = 100.f; ///it is only used for 'explicit' version of gyroscopic force
		m_singleAxisRollingFrictionThreshold = 1e30f;///if the velocity is above this threshold, it will use a single constraint row (axis), otherwise 3 rows.
	}